

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZEqnArray<double>_>::TPZVec
          (TPZVec<TPZEqnArray<double>_> *this,initializer_list<TPZEqnArray<double>_> *list)

{
  undefined1 auVar1 [16];
  long lVar2;
  TPZEqnArray<double> *pTVar3;
  ulong uVar4;
  size_type *psVar5;
  const_iterator pTVar6;
  initializer_list<TPZEqnArray<double>_> *in_RSI;
  undefined8 *in_RDI;
  ulong uVar7;
  TPZEqnArray<double> *aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  TPZEqnArray<double> *in_stack_ffffffffffffff68;
  TPZEqnArray<double> *in_stack_ffffffffffffff70;
  size_type *local_70;
  TPZEqnArray<double> *this_00;
  const_iterator local_30;
  
  *in_RDI = &PTR__TPZVec_025506a8;
  in_RDI[1] = 0;
  pTVar3 = (TPZEqnArray<double> *)std::initializer_list<TPZEqnArray<double>_>::size(in_RSI);
  if (pTVar3 != (TPZEqnArray<double> *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pTVar3;
    uVar4 = SUB168(auVar1 * ZEXT816(0x3290),0);
    uVar7 = uVar4 + 8;
    if (SUB168(auVar1 * ZEXT816(0x3290),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar7 = 0xffffffffffffffff;
    }
    this_00 = pTVar3;
    psVar5 = (size_type *)operator_new__(uVar7);
    *psVar5 = (size_type)this_00;
    psVar5 = psVar5 + 1;
    if (this_00 != (TPZEqnArray<double> *)0x0) {
      lVar2 = (long)this_00 * 0x652;
      local_70 = psVar5;
      do {
        TPZEqnArray<double>::TPZEqnArray(this_00);
        local_70 = local_70 + 0x652;
      } while (local_70 != psVar5 + lVar2);
    }
    in_RDI[1] = psVar5;
  }
  local_30 = std::initializer_list<TPZEqnArray<double>_>::begin(in_RSI);
  pTVar6 = std::initializer_list<TPZEqnArray<double>_>::end
                     ((initializer_list<TPZEqnArray<double>_> *)in_stack_ffffffffffffff70);
  for (; local_30 != pTVar6; local_30 = local_30 + 1) {
    TPZEqnArray<double>::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  in_RDI[2] = pTVar3;
  in_RDI[3] = pTVar3;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}